

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

pair<int,_int> __thiscall Imf_3_3::DeepScanLineInputFile::Data::getChunkRange(Data *this,int y)

{
  exr_result_t eVar1;
  ostream *poVar2;
  undefined8 uVar3;
  char *pcVar4;
  ArgExc *this_00;
  long *plVar5;
  int in_ESI;
  int64_t yoff;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  int32_t scansperchunk;
  exr_attr_box2i_t dw;
  pair<int,_int> ret;
  stringstream *in_stack_fffffffffffffc48;
  ArgExc *in_stack_fffffffffffffc50;
  exr_const_context_t in_stack_fffffffffffffc58;
  long local_358;
  long local_350;
  stringstream local_348 [16];
  ostream local_338 [296];
  Context *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffe1c;
  Context *in_stack_fffffffffffffe20;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  int local_28;
  exr_attr_box2i_t local_24;
  int local_14;
  pair<int,_int> local_8;
  
  local_14 = in_ESI;
  local_24 = Context::dataWindow(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  local_28 = 1;
  if ((local_24.min.y <= local_14) && (local_14 <= local_24.max.y)) {
    Context::operator_cast_to__priv_exr_context_t_((Context *)0xa7a0d3);
    eVar1 = exr_get_scanlines_per_chunk
                      (in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                       (int32_t *)in_stack_fffffffffffffc48);
    if (eVar1 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_348);
      poVar2 = std::operator<<(local_338,"Error querying scanline counts from image file \"");
      pcVar4 = Context::fileName(in_stack_fffffffffffffdf0);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::operator<<(poVar2,"\".");
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc(this_00,in_stack_fffffffffffffc48);
      __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    if (local_28 == 1) {
      local_8 = std::make_pair<int&,int&>((int *)in_stack_fffffffffffffc48,(int *)0xa7a1fb);
    }
    else {
      std::pair<int,_int>::pair<int,_int,_true>(&local_8);
      local_350 = (long)local_24.min.y +
                  (long)local_28 * (((long)local_14 - (long)local_24.min.y) / (long)local_28);
      local_8.first = (int)local_350;
      local_350 = local_28 + local_350;
      local_358 = (long)local_24.max.y;
      plVar5 = std::min<long>(&local_350,&local_358);
      local_8.second = (int)*plVar5;
    }
    return local_8;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = std::operator<<(local_1a0,"Requested scanline ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
  poVar2 = std::operator<<(poVar2," is outside the image file\'s data window: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24.min.y);
  poVar2 = std::operator<<(poVar2," - ");
  std::ostream::operator<<(poVar2,local_24.max.y);
  uVar3 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  __cxa_throw(uVar3,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

std::pair<int, int> DeepScanLineInputFile::Data::getChunkRange (int y) const
{
    exr_attr_box2i_t dw = _ctxt->dataWindow (partNumber);
    int32_t scansperchunk = 1;

    if (y < dw.min.y || y > dw.max.y)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Requested scanline " << y << " is outside "
            "the image file's data window: "
            << dw.min.y << " - " << dw.max.y);
    }

    if (EXR_ERR_SUCCESS != exr_get_scanlines_per_chunk (*_ctxt, partNumber, &scansperchunk))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error querying scanline counts from image "
            "file \"" << _ctxt->fileName () << "\".");
    }

    if (scansperchunk == 1)
        return std::make_pair( y, y );

    std::pair<int, int> ret;
    int64_t yoff;

    yoff = (int64_t) y;
    yoff -= (int64_t) dw.min.y;
    yoff /= (int64_t) scansperchunk;

    yoff *= (int64_t) scansperchunk;
    yoff += (int64_t) dw.min.y;

    ret.first = (int32_t) yoff;
    yoff += (int64_t) scansperchunk;
    yoff = std::min (yoff, (int64_t) dw.max.y);
    ret.second = (int32_t) yoff;

    return ret;
}